

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateTranslationNodeAnim
          (FBXConverter *this,string *name,Model *param_2,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time,
          bool inverse)

{
  _Head_base<0UL,_aiNodeAnim_*,_false> na_00;
  long lVar1;
  aiVectorKey *paVar2;
  aiQuatKey *paVar3;
  LayerMap *pLVar4;
  ulong uVar5;
  pointer __p;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  
  pLVar4 = (LayerMap *)curves;
  na_00._M_head_impl = (aiNodeAnim *)operator_new(0x438);
  ((na_00._M_head_impl)->mNodeName).length = 0;
  ((na_00._M_head_impl)->mNodeName).data[0] = '\0';
  memset(((na_00._M_head_impl)->mNodeName).data + 1,0x1b,0x3ff);
  (na_00._M_head_impl)->mRotationKeys = (aiQuatKey *)0x0;
  (na_00._M_head_impl)->mNumScalingKeys = 0;
  *(undefined8 *)&(na_00._M_head_impl)->mNumPositionKeys = 0;
  *(undefined8 *)((long)&(na_00._M_head_impl)->mPositionKeys + 4) = 0;
  (na_00._M_head_impl)->mScalingKeys = (aiVectorKey *)0x0;
  (na_00._M_head_impl)->mPreState = aiAnimBehaviour_DEFAULT;
  (na_00._M_head_impl)->mPostState = aiAnimBehaviour_DEFAULT;
  uVar5 = name->_M_string_length;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)na_00._M_head_impl;
  if (uVar5 < 0x400) {
    ((na_00._M_head_impl)->mNodeName).length = (ai_uint32)uVar5;
    memcpy(((na_00._M_head_impl)->mNodeName).data,(name->_M_dataplus)._M_p,uVar5);
    ((na_00._M_head_impl)->mNodeName).data[uVar5] = '\0';
  }
  ConvertTranslationKeys(this,na_00._M_head_impl,curves,pLVar4,start,stop,max_time,min_time);
  if ((inverse) && ((na_00._M_head_impl)->mNumPositionKeys != 0)) {
    lVar1 = 0x10;
    uVar5 = 0;
    do {
      paVar2 = *(aiVectorKey **)((long)na_00._M_head_impl + 0x408);
      *(ulong *)((long)paVar2 + lVar1 + -8) =
           *(ulong *)((long)paVar2 + lVar1 + -8) ^ 0x8000000080000000;
      *(uint *)((long)&paVar2->mTime + lVar1) = *(uint *)((long)&paVar2->mTime + lVar1) ^ 0x80000000
      ;
      uVar5 = uVar5 + 1;
      lVar1 = lVar1 + 0x18;
      na_00._M_head_impl = (aiNodeAnim *)na;
    } while (uVar5 < *(uint *)((long)na._M_t.
                                     super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                     .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl +
                              0x404));
  }
  paVar2 = (aiVectorKey *)operator_new__(0x18);
  *(aiVectorKey **)((long)na_00._M_head_impl + 0x428) = paVar2;
  *(uint *)((long)na_00._M_head_impl + 0x420) = 1;
  paVar2->mTime = 0.0;
  (paVar2->mValue).x = 1.0;
  (paVar2->mValue).y = 1.0;
  (paVar2->mValue).z = 1.0;
  paVar3 = (aiQuatKey *)operator_new__(0x18);
  *(aiQuatKey **)((long)na_00._M_head_impl + 0x418) = paVar3;
  *(uint *)((long)na_00._M_head_impl + 0x410) = 1;
  paVar3->mTime = 0.0;
  (paVar3->mValue).w = 1.0;
  (paVar3->mValue).x = 0.0;
  (paVar3->mValue).y = 0.0;
  (paVar3->mValue).z = 0.0;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0;
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&na);
  return na_00._M_head_impl;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateTranslationNodeAnim(const std::string& name,
            const Model& /*target*/,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool inverse) {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertTranslationKeys(na.get(), curves, layer_map, start, stop, max_time, min_time);

            if (inverse) {
                for (unsigned int i = 0; i < na->mNumPositionKeys; ++i) {
                    na->mPositionKeys[i].mValue *= -1.0f;
                }
            }

            // dummy scaling key
            na->mScalingKeys = new aiVectorKey[1];
            na->mNumScalingKeys = 1;

            na->mScalingKeys[0].mTime = 0.;
            na->mScalingKeys[0].mValue = aiVector3D(1.0f, 1.0f, 1.0f);

            // dummy rotation key
            na->mRotationKeys = new aiQuatKey[1];
            na->mNumRotationKeys = 1;

            na->mRotationKeys[0].mTime = 0.;
            na->mRotationKeys[0].mValue = aiQuaternion();

            return na.release();
        }